

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaParser::ReadMetaDataItem(ColladaParser *this,StringMetaData *metadata)

{
  pointer ppVar1;
  __type _Var2;
  int iVar3;
  MetaKeyPairVector *pMVar4;
  undefined4 extraout_var;
  char *sz;
  size_t i;
  ulong uVar5;
  long lVar6;
  string camel_key_str;
  string key_str;
  aiString aistr;
  
  pMVar4 = Collada::GetColladaAssimpMetaKeysCamelCase_abi_cxx11_();
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  if ((char *)CONCAT44(extraout_var,iVar3) == (char *)0x0) {
    SkipElement(this);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&key_str,(char *)CONCAT44(extraout_var,iVar3),(allocator<char> *)&aistr);
  sz = TestTextContent(this);
  if (sz != (char *)0x0) {
    aistr.length = 0;
    aistr.data[0] = '\0';
    memset(aistr.data + 1,0x1b,0x3ff);
    aiString::Set(&aistr,sz);
    std::__cxx11::string::string((string *)&camel_key_str,(string *)&key_str);
    Collada::ToCamelCase(&camel_key_str);
    lVar6 = 0x20;
    for (uVar5 = 0;
        ppVar1 = (pMVar4->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(pMVar4->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 6);
        uVar5 = uVar5 + 1) {
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)ppVar1 + lVar6 + -0x20),&camel_key_str);
      if (_Var2) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,aiString&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
                    *)metadata,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(((pMVar4->
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                   lVar6),&aistr);
        goto LAB_003f9cef;
      }
      lVar6 = lVar6 + 0x40;
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
    ::_M_emplace_unique<std::__cxx11::string&,aiString&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
                *)metadata,&camel_key_str,&aistr);
LAB_003f9cef:
    std::__cxx11::string::~string((string *)&camel_key_str);
  }
  TestClosing(this,key_str._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&key_str);
  return;
}

Assistant:

void ColladaParser::ReadMetaDataItem(StringMetaData &metadata) {
    const Collada::MetaKeyPairVector &key_renaming = GetColladaAssimpMetaKeysCamelCase();
	// Metadata such as created, keywords, subject etc
	const char *key_char = mReader->getNodeName();
	if (key_char != nullptr) {
        const std::string key_str(key_char);
		const char *value_char = TestTextContent();
		if (value_char != nullptr) {
            aiString aistr;
			aistr.Set(value_char);

            std::string camel_key_str(key_str);
			ToCamelCase(camel_key_str);

			size_t found_index;
			if (FindCommonKey(camel_key_str, key_renaming, found_index)) {
                metadata.emplace(key_renaming[found_index].second, aistr);
            } else {
				metadata.emplace(camel_key_str, aistr);
			}
        }
        TestClosing(key_str.c_str());
    }
    else
        SkipElement();
}